

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssl_shim.cc
# Opt level: O2

bool DoExchange(UniquePtr<SSL_SESSION> *out_session,UniquePtr<SSL> *ssl_uniqueptr,TestConfig *config
               ,bool is_resume,bool is_retry,SettingsWriter *writer)

{
  MockQuicTransport *this;
  SSL *pSVar1;
  uchar *ssl_00;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  TestState *pTVar7;
  SSL_CTX *src;
  tuple<unsigned_char_*,_std::default_delete<unsigned_char[]>_> out;
  TestState *pTVar8;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> __s;
  bool *pbVar9;
  SSL_SESSION *session;
  undefined7 in_register_00000009;
  long lVar10;
  SSL *ssl_01;
  char *pcVar11;
  char *__format;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  FILE *__stream;
  undefined7 in_register_00000081;
  ulong uVar12;
  size_t sVar13;
  SSL *ssl;
  uint local_e0;
  uint local_dc;
  Span<const_unsigned_char> write_secret;
  __array buf_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  uint8_t buf_2;
  undefined4 local_8c;
  SSL_CTX *local_88;
  uint16_t secret_len;
  undefined6 uStack_7e;
  TestConfig *config_1;
  TestState *local_70;
  TestConfig *local_68;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *local_60;
  ulong local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_8c = (undefined4)CONCAT71(in_register_00000081,is_retry);
  ssl_01 = (SSL *)(ssl_uniqueptr->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
  ssl = (SSL *)ssl_01;
  local_60 = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)out_session;
  local_88 = (SSL_CTX *)SSL_get_SSL_CTX(ssl_01);
  pTVar7 = GetTestState((SSL *)ssl_01);
  local_e0 = (uint)CONCAT71(in_register_00000009,is_resume);
  uVar6 = (uint)is_resume;
  if (config->implicit_handshake == false) {
    if (config->handoff == true) {
      bVar2 = DoSplitHandshake(ssl_uniqueptr,writer,is_resume);
      if (!bVar2) {
        return false;
      }
      ssl = (ssl_uniqueptr->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
      pTVar7 = GetTestState(ssl);
    }
    local_dc = (uint)is_resume;
    local_70 = pTVar7;
    local_68 = config;
    do {
      local_50._8_8_ = 0;
      local_38 = std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc:998:59)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc:998:59)>
                 ::_M_manager;
      local_50._M_unused._M_object = &ssl;
      iVar4 = CheckIdempotentError("SSL_do_handshake",ssl,(function<int_()> *)&local_50);
      std::_Function_base::~_Function_base((_Function_base *)&local_50);
      bVar2 = RetryAsync(ssl,iVar4);
      config = local_68;
    } while (bVar2);
    if (local_68->forbid_renegotiation_after_handshake == true) {
      SSL_set_renegotiate_mode(ssl,ssl_renegotiate_never);
    }
    pTVar7 = local_70;
    uVar6 = local_dc;
    if (iVar4 != 1) {
      return false;
    }
    bVar2 = CheckHandshakeProperties(ssl,SUB41(local_dc,0),config);
    if (!bVar2) {
      return false;
    }
    src = (SSL_CTX *)SSL_get_SSL_CTX((SSL *)ssl);
    CopySessions(local_88,src);
    if (((((char)local_e0 == '\x01' && (char)local_8c == '\0') && (config->is_server == false)) &&
        (config->expect_no_offer_early_data == true)) &&
       (iVar4 = SSL_in_early_data(ssl), iVar4 != 0)) {
      pcVar11 = "Client unexpectedly offered early data.\n";
    }
    else {
      uVar5 = 0;
      if (config->handshake_twice == true) {
        do {
          uVar5 = SSL_do_handshake((SSL *)ssl);
          bVar2 = RetryAsync(ssl,uVar5);
        } while (bVar2);
        if (uVar5 != 1) {
          return false;
        }
      }
      if ((config->no_op_extra_handshake != true) ||
         (iVar4 = SSL_do_handshake((SSL *)ssl), iVar4 == 1)) {
        if (config->early_write_after_message == 0) {
LAB_0011ef6f:
          ssl_01 = (SSL *)(ulong)uVar5;
          pTVar7->got_new_session = false;
          goto LAB_0011ebb4;
        }
        iVar4 = SSL_in_early_data(ssl);
        if ((iVar4 == 0) || (config->is_server == true)) {
          pcVar11 = "-early-write-after-message only works for 0-RTT connections on servers.\n";
          sVar13 = 0x48;
          goto LAB_0011f821;
        }
        if ((config->shim_writes_first != true) || (config->async != true)) {
          pcVar11 = "-early-write-after-message requires -shim-writes-first and -async.\n";
          sVar13 = 0x43;
          goto LAB_0011f821;
        }
        do {
          uVar5 = SSL_do_handshake((SSL *)ssl);
          if (pTVar7->last_message_received == config->early_write_after_message) break;
          bVar2 = RetryAsync(ssl,uVar5);
        } while (bVar2);
        if (uVar5 != 1) {
          if (pTVar7->last_message_received != config->early_write_after_message) {
            return false;
          }
          goto LAB_0011ef6f;
        }
        pcVar11 = "Handshake unexpectedly succeeded.\n";
LAB_0011f73a:
        sVar13 = 0x22;
        goto LAB_0011f821;
      }
      pcVar11 = "Extra SSL_do_handshake was not a no-op.\n";
    }
    sVar13 = 0x28;
    goto LAB_0011f821;
  }
LAB_0011ebb4:
  if (0 < (long)config->export_keying_material) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&result,(long)config->export_keying_material,(allocator_type *)&write_secret);
    iVar4 = SSL_export_keying_material
                      ((SSL *)ssl,
                       result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)result.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)result.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                       (config->export_label)._M_dataplus._M_p,
                       (config->export_label)._M_string_length,
                       (uchar *)(config->export_context)._M_dataplus._M_p,
                       (config->export_context)._M_string_length,(uint)config->use_export_context);
    if (iVar4 == 0) {
      fwrite("failed to export keying material\n",0x21,1,_stderr);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return false;
    }
    uVar5 = WriteAll(ssl,result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                     (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    ssl_01 = (SSL *)(ulong)uVar5;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    if ((int)uVar5 < 0) {
      return false;
    }
  }
  if (config->export_traffic_secrets == true) {
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    write_secret.data_ = (uchar *)0x0;
    write_secret.size_ = 0;
    bVar2 = bssl::SSL_get_traffic_secrets(ssl,(Span<const_unsigned_char> *)&result,&write_secret);
    if (!bVar2) {
      pcVar11 = "failed to export traffic secrets\n";
      sVar13 = 0x21;
      goto LAB_0011f821;
    }
    if ((pointer)0xffff <
        result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("read_secret.size() <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc"
                    ,0x449,
                    "bool DoExchange(bssl::UniquePtr<SSL_SESSION> *, bssl::UniquePtr<SSL> *, const TestConfig *, bool, bool, SettingsWriter *)"
                   );
    }
    if ((pointer)write_secret.size_ !=
        result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("write_secret.size() == read_secret.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc"
                    ,0x44a,
                    "bool DoExchange(bssl::UniquePtr<SSL_SESSION> *, bssl::UniquePtr<SSL> *, const TestConfig *, bool, bool, SettingsWriter *)"
                   );
    }
    _secret_len = (uchar *)CONCAT62(uStack_7e,
                                    (short)result.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
    iVar4 = WriteAll(ssl,&secret_len,2);
    if (iVar4 < 0) {
      return false;
    }
    iVar4 = WriteAll(ssl,result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                     (size_t)result.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
    if (iVar4 < 0) {
      return false;
    }
    iVar4 = WriteAll(ssl,write_secret.data_,write_secret.size_);
    if (iVar4 < 0) {
      return false;
    }
  }
  if (config->tls_unique == true) {
    iVar4 = SSL_get_tls_unique(ssl,(uint8_t *)&result,(size_t *)&write_secret,0x10);
    if (iVar4 == 0) {
      pcVar11 = "failed to get tls-unique\n";
      sVar13 = 0x19;
      goto LAB_0011f821;
    }
    if (write_secret.data_ != (uchar *)0xc) {
      fprintf(_stderr,"expected 12 bytes of tls-unique but got %u");
      return false;
    }
    iVar4 = WriteAll(ssl,&result,0xc);
    if (iVar4 < 0) {
      return false;
    }
  }
  pSVar1 = ssl;
  if (config->send_alert == true) {
    do {
      iVar4 = SSL_send_fatal_alert(pSVar1,'\x1e');
      bVar2 = RetryAsync(pSVar1,iVar4);
    } while (bVar2);
    return -1 < iVar4;
  }
  if (config->write_different_record_sizes == true) {
    if (config->is_dtls != true) {
      result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new__(0x8001);
      memset(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0x42,0x8001);
      lVar10 = 0;
      do {
        if (lVar10 == 0x58) {
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&result);
          goto LAB_0011f4b7;
        }
        iVar4 = WriteAll(ssl,result.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                         *(size_t *)((long)DoExchange::kRecordSizes + lVar10));
        lVar10 = lVar10 + 8;
      } while (-1 < iVar4);
      this_00 = &result;
      goto LAB_0011f55f;
    }
    pcVar11 = "write_different_record_sizes not supported for DTLS\n";
    sVar13 = 0x34;
    goto LAB_0011f821;
  }
  bVar2 = config->read_with_unfinished_write;
  if (bVar2 == true) {
    if (config->async != false) {
      if (config->is_quic == true) {
        pcVar11 = "-read-with-unfinished-write is incompatible with QUIC.\n";
        sVar13 = 0x37;
        goto LAB_0011f821;
      }
      AsyncBioAllowWrite(pTVar7->async_bio,1);
      iVar4 = SSL_write((SSL *)ssl,"hello",5);
      iVar4 = SSL_get_error((SSL *)ssl,iVar4);
      if (iVar4 != 3) {
        pcVar11 = "Failed to leave unfinished write.\n";
        goto LAB_0011f73a;
      }
      goto LAB_0011f078;
    }
    pcVar11 = "-read-with-unfinished-write requires -async.\n";
  }
  else {
    if ((config->shim_writes_first == true) && (iVar4 = WriteAll(ssl,"hello",5), iVar4 < 0)) {
      return false;
    }
LAB_0011f078:
    if (config->shim_shuts_down == false) {
      local_88 = (SSL_CTX *)CONCAT44(local_88._4_4_,(int)CONCAT71((int7)((ulong)ssl_01 >> 8),bVar2))
      ;
      local_e0 = local_e0 ^ 1;
      local_dc = uVar6;
LAB_0011f09e:
      if ((config->key_update_before_read == true) && (iVar4 = SSL_key_update(ssl,0), iVar4 == 0)) {
        pcVar11 = "SSL_key_update failed.\n";
        sVar13 = 0x17;
        goto LAB_0011f821;
      }
      pSVar1 = ssl;
      uVar12 = 0x200;
      if (config->is_dtls != false) {
        uVar12 = 0x4000;
      }
      if (0 < (long)config->read_size) {
        uVar12 = (long)config->read_size;
      }
      out.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>)
           operator_new__(uVar12);
      memset((void *)out.
                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                     super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,uVar12);
      write_secret.data_ = (uchar *)pSVar1;
      buf_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           out.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      _secret_len = (uchar *)out.
                             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                             .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      local_58 = uVar12;
      config_1 = GetTestConfig(pSVar1);
      pTVar8 = GetTestState(pSVar1);
      this = (pTVar8->quic_transport)._M_t.
             super___uniq_ptr_impl<MockQuicTransport,_std::default_delete<MockQuicTransport>_>._M_t.
             super__Tuple_impl<0UL,_MockQuicTransport_*,_std::default_delete<MockQuicTransport>_>.
             super__Head_base<0UL,_MockQuicTransport_*,_false>._M_head_impl;
      if (this == (MockQuicTransport *)0x0) {
        do {
          ssl_00 = write_secret.data_;
          result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
          *(TestConfig ***)
           result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start = &config_1;
          *(Span<const_unsigned_char> **)
           ((long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start + 8) = &write_secret;
          *(uint16_t **)
           ((long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x10) = &secret_len;
          *(ulong **)
           ((long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x18) = &local_58;
          result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc:216:58)>
                        ::_M_manager;
          uVar6 = CheckIdempotentError
                            ("SSL_peek/SSL_read",(SSL *)ssl_00,(function<int_()> *)&result);
          std::_Function_base::~_Function_base((_Function_base *)&result);
          if ((config_1->use_exporter_between_reads == true) &&
             (iVar4 = SSL_export_keying_material
                                ((SSL *)write_secret.data_,&buf_2,1,(char *)0x0,0,(uchar *)0x0,0,0),
             iVar4 == 0)) {
            fwrite("failed to export keying material\n",0x21,1,_stderr);
            goto LAB_0011f3f1;
          }
          bVar2 = RetryAsync((SSL *)write_secret.data_,uVar6);
        } while (bVar2);
        if ((0 < (int)uVar6) && (config_1->peek_then_read != false)) {
          uVar12 = (ulong)uVar6;
          __s.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
               operator_new__(uVar12);
          memset((void *)__s.
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,0,uVar12);
          _buf_2 = (uchar *)__s.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          uVar5 = SSL_peek((SSL *)write_secret.data_,
                           (void *)__s.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,uVar6
                          );
          if ((uVar5 == uVar6) &&
             (iVar4 = bcmp((void *)__s.
                                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                   .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                           _secret_len,uVar12), iVar4 == 0)) {
            uVar5 = SSL_read((SSL *)write_secret.data_,
                             (void *)__s.
                                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                             uVar6);
            if ((uVar5 == uVar6) && (iVar4 = bcmp(_buf_2,_secret_len,uVar12), iVar4 == 0)) {
              std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                        ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         &buf_2);
              goto LAB_0011f147;
            }
            pcVar11 = "SSL_peek and SSL_read did not match.\n";
            sVar13 = 0x25;
          }
          else {
            pcVar11 = "First and second SSL_peek did not match.\n";
            sVar13 = 0x29;
          }
          fwrite(pcVar11,sVar13,1,_stderr);
          std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                    ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&buf_2);
LAB_0011f3f1:
          uVar6 = 0xffffffff;
        }
      }
      else {
        uVar6 = MockQuicTransport::ReadApplicationData
                          (this,(uint8_t *)
                                out.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,uVar12);
      }
LAB_0011f147:
      iVar4 = SSL_get_error((SSL *)ssl,uVar6);
      if (iVar4 == 6) {
        if (uVar6 != 0) goto LAB_0011f53e;
LAB_0011f4a8:
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&buf_1)
        ;
        uVar6 = local_dc;
        goto LAB_0011f4b7;
      }
      if (iVar4 == 5 && uVar6 == 0) goto LAB_0011f4a8;
      if (iVar4 == 0) {
        if ((int)uVar6 < 1) goto LAB_0011f53e;
        if (((config->is_server == false && (char)local_e0 == '\0') && (char)local_8c == '\0') &&
           (config->expect_reject_early_data == true)) {
          pcVar11 = "Unexpectedly received data instead of 0-RTT reject.\n";
          sVar13 = 0x34;
          goto LAB_0011f551;
        }
        if ((pTVar7->handshake_done == false) && (iVar4 = SSL_early_data_accepted(ssl), iVar4 == 0))
        {
          pcVar11 = "handshake was not completed after SSL_read\n";
          sVar13 = 0x2b;
          goto LAB_0011f551;
        }
        if ((((ulong)local_88 & 1) != 0) && (iVar4 = WriteAll(ssl,"hello",5), iVar4 < 0))
        goto LAB_0011f55a;
        if ((config->key_update == true) && (iVar4 = SSL_key_update(ssl,0), iVar4 == 0)) {
          pcVar11 = "SSL_key_update failed.\n";
          sVar13 = 0x17;
          goto LAB_0011f551;
        }
        for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
          *(byte *)((long)buf_1._M_t.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar12) =
               ~*(byte *)((long)buf_1._M_t.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar12
                         );
        }
        iVar4 = WriteAll(ssl,(void *)buf_1._M_t.
                                     super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                     .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                         (ulong)uVar6);
        if (iVar4 < 0) goto LAB_0011f55a;
        std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&buf_1)
        ;
        local_88 = (SSL_CTX *)((ulong)local_88 & 0xffffffff00000000);
        goto LAB_0011f09e;
      }
      if (0 < (int)uVar6) {
LAB_0011f53e:
        pcVar11 = "Invalid SSL_get_error output\n";
        sVar13 = 0x1d;
LAB_0011f551:
        fwrite(pcVar11,sVar13,1,_stderr);
      }
LAB_0011f55a:
      this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buf_1;
LAB_0011f55f:
      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)this_00);
      return false;
    }
LAB_0011f4b7:
    if ((((config->is_server == false) && (config->false_start == false)) &&
        (config->implicit_handshake == false)) &&
       ((uVar3 = GetProtocolVersion(ssl), uVar3 < 0x304 && (pTVar7->got_new_session == true)))) {
      pcVar11 = "new session was established after the handshake\n";
      sVar13 = 0x30;
      goto LAB_0011f821;
    }
    uVar3 = GetProtocolVersion(ssl);
    if ((0x303 < uVar3) && (config->is_server == false)) {
      if ((config->expect_no_session == false) && (config->shim_shuts_down == false)) {
        bVar2 = IsPAKE(ssl);
        bVar2 = !bVar2;
      }
      else {
        bVar2 = false;
      }
      if (pTVar7->got_new_session != bVar2) {
        pcVar11 = " not";
        if (pTVar7->got_new_session != false) {
          pcVar11 = "";
        }
        __format = "new session was%s cached, but we expected the opposite\n";
LAB_0011f8a1:
        fprintf(_stderr,__format,pcVar11);
        return false;
      }
      if (bVar2 != false) {
        iVar4 = SSL_SESSION_early_data_capable
                          ((pTVar7->new_session)._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
        if (config->expect_ticket_supports_early_data != (iVar4 != 0)) {
          pcVar11 = " not";
          if (iVar4 != 0) {
            pcVar11 = "";
          }
          __format = "new session did%s support early data, but we expected the opposite\n";
          goto LAB_0011f8a1;
        }
        if ((config->expect_resumable_across_names).super__Optional_base<bool,_true,_true>.
            _M_payload.super__Optional_payload_base<bool>._M_engaged == true) {
          iVar4 = SSL_SESSION_is_resumable_across_names
                            ((pTVar7->new_session)._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
          pbVar9 = std::optional<bool>::value(&config->expect_resumable_across_names);
          if (*pbVar9 != (iVar4 != 0)) {
            pcVar11 = " not";
            if (iVar4 != 0) {
              pcVar11 = "";
            }
            __format = 
            "new session did%s support cross-name resumption, but we expected the opposite\n";
            goto LAB_0011f8a1;
          }
        }
      }
    }
    if (local_60 != (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)0x0) {
      std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::operator=
                (local_60,(__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
                          &pTVar7->new_session);
    }
    uVar5 = DoShutdown(ssl);
    if ((config->shim_shuts_down == true) && (config->check_close_notify == true)) {
      if (uVar5 != 0) {
        pcVar11 = "Unexpected SSL_shutdown result: %d != 0\n";
        goto LAB_0011f801;
      }
      uVar5 = DoShutdown(ssl);
    }
    if (uVar5 != 1) {
      pcVar11 = "Unexpected SSL_shutdown result: %d != 1\n";
LAB_0011f801:
      fprintf(_stderr,pcVar11,(ulong)uVar5);
      return false;
    }
    iVar4 = SSL_total_renegotiations(ssl);
    if (iVar4 < 1) {
LAB_0011f676:
      uVar5 = SSL_total_renegotiations(ssl);
      __stream = _stderr;
      uVar6 = config->expect_total_renegotiations;
      if (uVar5 == uVar6) {
        if (config->renegotiate_explicit != true) {
          return true;
        }
        iVar4 = SSL_total_renegotiations(ssl);
        __stream = _stderr;
        if (iVar4 == pTVar7->explicit_renegotiates) {
          return true;
        }
        uVar6 = SSL_total_renegotiations(ssl);
        uVar5 = pTVar7->explicit_renegotiates;
        pcVar11 = "Performed %d renegotiations, but triggered %d of them\n";
      }
      else {
        uVar5 = SSL_total_renegotiations(ssl);
        pcVar11 = "Expected %d renegotiations, got %d\n";
      }
      fprintf(__stream,pcVar11,(ulong)uVar6,(ulong)uVar5);
      return false;
    }
    session = SSL_get_session((SSL *)ssl);
    iVar4 = SSL_SESSION_is_resumable((SSL_SESSION *)session);
    if (iVar4 != 0) {
      pcVar11 = "Renegotiations should never produce resumable sessions.\n";
      sVar13 = 0x38;
      goto LAB_0011f821;
    }
    iVar4 = SSL_session_reused(ssl);
    if (iVar4 == 0) {
      bVar2 = CheckAuthProperties(ssl,SUB41(uVar6,0),config);
      if (!bVar2) {
        return false;
      }
      goto LAB_0011f676;
    }
    pcVar11 = "Renegotiations should never resume sessions.\n";
  }
  sVar13 = 0x2d;
LAB_0011f821:
  fwrite(pcVar11,sVar13,1,_stderr);
  return false;
}

Assistant:

static bool DoExchange(bssl::UniquePtr<SSL_SESSION> *out_session,
                       bssl::UniquePtr<SSL> *ssl_uniqueptr,
                       const TestConfig *config, bool is_resume, bool is_retry,
                       SettingsWriter *writer) {
  int ret;
  SSL *ssl = ssl_uniqueptr->get();
  SSL_CTX *session_ctx = SSL_get_SSL_CTX(ssl);
  TestState *test_state = GetTestState(ssl);

  if (!config->implicit_handshake) {
    if (config->handoff) {
#if defined(HANDSHAKER_SUPPORTED)
      if (!DoSplitHandshake(ssl_uniqueptr, writer, is_resume)) {
        return false;
      }
      ssl = ssl_uniqueptr->get();
      test_state = GetTestState(ssl);
#else
      fprintf(stderr, "The external handshaker can only be used on Linux\n");
      return false;
#endif
    }

    do {
      ret = CheckIdempotentError("SSL_do_handshake", ssl, [&]() -> int {
        return SSL_do_handshake(ssl);
      });
    } while (RetryAsync(ssl, ret));

    if (config->forbid_renegotiation_after_handshake) {
      SSL_set_renegotiate_mode(ssl, ssl_renegotiate_never);
    }

    if (ret != 1 || !CheckHandshakeProperties(ssl, is_resume, config)) {
      return false;
    }

    CopySessions(session_ctx, SSL_get_SSL_CTX(ssl));

    if (is_resume && !is_retry && !config->is_server &&
        config->expect_no_offer_early_data && SSL_in_early_data(ssl)) {
      fprintf(stderr, "Client unexpectedly offered early data.\n");
      return false;
    }

    if (config->handshake_twice) {
      do {
        ret = SSL_do_handshake(ssl);
      } while (RetryAsync(ssl, ret));
      if (ret != 1) {
        return false;
      }
    }

    // Skip the |config->async| logic as this should be a no-op.
    if (config->no_op_extra_handshake && SSL_do_handshake(ssl) != 1) {
      fprintf(stderr, "Extra SSL_do_handshake was not a no-op.\n");
      return false;
    }

    if (config->early_write_after_message != 0) {
      if (!SSL_in_early_data(ssl) || config->is_server) {
        fprintf(stderr,
                "-early-write-after-message only works for 0-RTT connections "
                "on servers.\n");
        return false;
      }
      if (!config->shim_writes_first || !config->async) {
        fprintf(stderr,
                "-early-write-after-message requires -shim-writes-first and "
                "-async.\n");
        return false;
      }
      // Run the handshake until the specified message. Note that, if a
      // handshake record contains multiple messages, |SSL_do_handshake| usually
      // processes both atomically. The test must ensure there is a record
      // boundary after the desired message. Checking |last_message_received|
      // confirms this.
      do {
        ret = SSL_do_handshake(ssl);
      } while (test_state->last_message_received !=
                   config->early_write_after_message &&
               RetryAsync(ssl, ret));
      if (ret == 1) {
        fprintf(stderr, "Handshake unexpectedly succeeded.\n");
        return false;
      }
      if (test_state->last_message_received !=
          config->early_write_after_message) {
        // The handshake failed before we saw the target message. The generic
        // error-handling logic in the caller will print the error.
        return false;
      }
    }

    // Reset the state to assert later that the callback isn't called in
    // renegotations.
    test_state->got_new_session = false;
  }

  if (config->export_keying_material > 0) {
    std::vector<uint8_t> result(
        static_cast<size_t>(config->export_keying_material));
    if (!SSL_export_keying_material(
            ssl, result.data(), result.size(), config->export_label.data(),
            config->export_label.size(),
            reinterpret_cast<const uint8_t *>(config->export_context.data()),
            config->export_context.size(), config->use_export_context)) {
      fprintf(stderr, "failed to export keying material\n");
      return false;
    }
    if (WriteAll(ssl, result.data(), result.size()) < 0) {
      return false;
    }
  }

  if (config->export_traffic_secrets) {
    bssl::Span<const uint8_t> read_secret, write_secret;
    if (!SSL_get_traffic_secrets(ssl, &read_secret, &write_secret)) {
      fprintf(stderr, "failed to export traffic secrets\n");
      return false;
    }

    assert(read_secret.size() <= 0xffff);
    assert(write_secret.size() == read_secret.size());
    const uint16_t secret_len = read_secret.size();
    if (WriteAll(ssl, &secret_len, sizeof(secret_len)) < 0 ||
        WriteAll(ssl, read_secret.data(), read_secret.size()) < 0 ||
        WriteAll(ssl, write_secret.data(), write_secret.size()) < 0) {
      return false;
    }
  }

  if (config->tls_unique) {
    uint8_t tls_unique[16];
    size_t tls_unique_len;
    if (!SSL_get_tls_unique(ssl, tls_unique, &tls_unique_len,
                            sizeof(tls_unique))) {
      fprintf(stderr, "failed to get tls-unique\n");
      return false;
    }

    if (tls_unique_len != 12) {
      fprintf(stderr, "expected 12 bytes of tls-unique but got %u",
              static_cast<unsigned>(tls_unique_len));
      return false;
    }

    if (WriteAll(ssl, tls_unique, tls_unique_len) < 0) {
      return false;
    }
  }

  if (config->send_alert) {
    if (DoSendFatalAlert(ssl, SSL_AD_DECOMPRESSION_FAILURE) < 0) {
      return false;
    }
    return true;
  }

  if (config->write_different_record_sizes) {
    if (config->is_dtls) {
      fprintf(stderr, "write_different_record_sizes not supported for DTLS\n");
      return false;
    }
    // This mode writes a number of different record sizes in an attempt to
    // trip up the CBC record splitting code.
    static const size_t kBufLen = 32769;
    auto buf = std::make_unique<uint8_t[]>(kBufLen);
    OPENSSL_memset(buf.get(), 0x42, kBufLen);
    static const size_t kRecordSizes[] = {
        0, 1, 255, 256, 257, 16383, 16384, 16385, 32767, 32768, 32769};
    for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kRecordSizes); i++) {
      const size_t len = kRecordSizes[i];
      if (len > kBufLen) {
        fprintf(stderr, "Bad kRecordSizes value.\n");
        return false;
      }
      if (WriteAll(ssl, buf.get(), len) < 0) {
        return false;
      }
    }
  } else {
    static const char kInitialWrite[] = "hello";
    bool pending_initial_write = false;
    if (config->read_with_unfinished_write) {
      if (!config->async) {
        fprintf(stderr, "-read-with-unfinished-write requires -async.\n");
        return false;
      }
      if (config->is_quic) {
        fprintf(stderr,
                "-read-with-unfinished-write is incompatible with QUIC.\n");
        return false;
      }

      // Let only one byte of the record through.
      AsyncBioAllowWrite(test_state->async_bio, 1);
      int write_ret = SSL_write(ssl, kInitialWrite, strlen(kInitialWrite));
      if (SSL_get_error(ssl, write_ret) != SSL_ERROR_WANT_WRITE) {
        fprintf(stderr, "Failed to leave unfinished write.\n");
        return false;
      }
      pending_initial_write = true;
    } else if (config->shim_writes_first) {
      if (WriteAll(ssl, kInitialWrite, strlen(kInitialWrite)) < 0) {
        return false;
      }
    }
    if (!config->shim_shuts_down) {
      for (;;) {
        if (config->key_update_before_read &&
            !SSL_key_update(ssl, SSL_KEY_UPDATE_NOT_REQUESTED)) {
          fprintf(stderr, "SSL_key_update failed.\n");
          return false;
        }

        // Read only 512 bytes at a time in TLS to ensure records may be
        // returned in multiple reads.
        size_t read_size = config->is_dtls ? 16384 : 512;
        if (config->read_size > 0) {
          read_size = config->read_size;
        }
        auto buf = std::make_unique<uint8_t[]>(read_size);

        int n = DoRead(ssl, buf.get(), read_size);
        int err = SSL_get_error(ssl, n);
        if (err == SSL_ERROR_ZERO_RETURN ||
            (n == 0 && err == SSL_ERROR_SYSCALL)) {
          if (n != 0) {
            fprintf(stderr, "Invalid SSL_get_error output\n");
            return false;
          }
          // Stop on either clean or unclean shutdown.
          break;
        } else if (err != SSL_ERROR_NONE) {
          if (n > 0) {
            fprintf(stderr, "Invalid SSL_get_error output\n");
            return false;
          }
          return false;
        }
        // Successfully read data.
        if (n <= 0) {
          fprintf(stderr, "Invalid SSL_get_error output\n");
          return false;
        }

        if (!config->is_server && is_resume && !is_retry &&
            config->expect_reject_early_data) {
          fprintf(stderr,
                  "Unexpectedly received data instead of 0-RTT reject.\n");
          return false;
        }

        // After a successful read, with or without False Start, the handshake
        // must be complete unless we are doing early data.
        if (!test_state->handshake_done && !SSL_early_data_accepted(ssl)) {
          fprintf(stderr, "handshake was not completed after SSL_read\n");
          return false;
        }

        // Clear the initial write, if unfinished.
        if (pending_initial_write) {
          if (WriteAll(ssl, kInitialWrite, strlen(kInitialWrite)) < 0) {
            return false;
          }
          pending_initial_write = false;
        }

        if (config->key_update &&
            !SSL_key_update(ssl, SSL_KEY_UPDATE_NOT_REQUESTED)) {
          fprintf(stderr, "SSL_key_update failed.\n");
          return false;
        }

        for (int i = 0; i < n; i++) {
          buf[i] ^= 0xff;
        }
        if (WriteAll(ssl, buf.get(), n) < 0) {
          return false;
        }
      }
    }
  }

  if (!config->is_server && !config->false_start &&
      !config->implicit_handshake &&
      // Session tickets are sent post-handshake in TLS 1.3.
      GetProtocolVersion(ssl) < TLS1_3_VERSION && test_state->got_new_session) {
    fprintf(stderr, "new session was established after the handshake\n");
    return false;
  }

  if (GetProtocolVersion(ssl) >= TLS1_3_VERSION && !config->is_server) {
    bool expect_new_session =
        !config->expect_no_session && !config->shim_shuts_down && !IsPAKE(ssl);
    if (expect_new_session != test_state->got_new_session) {
      fprintf(stderr,
              "new session was%s cached, but we expected the opposite\n",
              test_state->got_new_session ? "" : " not");
      return false;
    }

    if (expect_new_session) {
      bool got_early_data =
          !!SSL_SESSION_early_data_capable(test_state->new_session.get());
      if (config->expect_ticket_supports_early_data != got_early_data) {
        fprintf(stderr,
                "new session did%s support early data, but we expected the "
                "opposite\n",
                got_early_data ? "" : " not");
        return false;
      }

      if (config->expect_resumable_across_names.has_value()) {
        bool actual = !!SSL_SESSION_is_resumable_across_names(
            test_state->new_session.get());
        if (config->expect_resumable_across_names.value() != actual) {
          fprintf(stderr,
                  "new session did%s support cross-name resumption, but we "
                  "expected the opposite\n",
                  actual ? "" : " not");
          return false;
        }
      }
    }
  }

  if (out_session) {
    *out_session = std::move(test_state->new_session);
  }

  ret = DoShutdown(ssl);

  if (config->shim_shuts_down && config->check_close_notify) {
    // We initiate shutdown, so |SSL_shutdown| will return in two stages. First
    // it returns zero when our close_notify is sent, then one when the peer's
    // is received.
    if (ret != 0) {
      fprintf(stderr, "Unexpected SSL_shutdown result: %d != 0\n", ret);
      return false;
    }
    ret = DoShutdown(ssl);
  }

  if (ret != 1) {
    fprintf(stderr, "Unexpected SSL_shutdown result: %d != 1\n", ret);
    return false;
  }

  if (SSL_total_renegotiations(ssl) > 0) {
    if (SSL_SESSION_is_resumable(SSL_get_session(ssl))) {
      fprintf(stderr,
              "Renegotiations should never produce resumable sessions.\n");
      return false;
    }

    if (SSL_session_reused(ssl)) {
      fprintf(stderr, "Renegotiations should never resume sessions.\n");
      return false;
    }

    // Re-check authentication properties after a renegotiation. The reported
    // values should remain unchanged even if the server sent different SCT
    // lists.
    if (!CheckAuthProperties(ssl, is_resume, config)) {
      return false;
    }
  }

  if (SSL_total_renegotiations(ssl) != config->expect_total_renegotiations) {
    fprintf(stderr, "Expected %d renegotiations, got %d\n",
            config->expect_total_renegotiations, SSL_total_renegotiations(ssl));
    return false;
  }

  if (config->renegotiate_explicit &&
      SSL_total_renegotiations(ssl) != test_state->explicit_renegotiates) {
    fprintf(stderr, "Performed %d renegotiations, but triggered %d of them\n",
            SSL_total_renegotiations(ssl), test_state->explicit_renegotiates);
    return false;
  }

  return true;
}